

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v3::load_kinematics_animated(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  xr_reader *s;
  xr_reader *local_18;
  
  load_kinematics(this,r);
  local_18 = xr_reader::open_chunk(r,0x1d);
  if (local_18 != (xr_reader *)0x0) {
    xr_reader::r_sz(local_18,&(this->super_xr_ogf).super_xr_object.m_motion_refs);
    pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 3);
    *pbVar1 = *pbVar1 | 0x20;
    goto LAB_001808b0;
  }
  local_18 = xr_reader::open_chunk(r,0x14);
  if (local_18 == (xr_reader *)0x0) {
    local_18 = xr_reader::open_chunk(r,0x12);
    if (local_18 != (xr_reader *)0x0) {
      load_s_smparams(this,local_18);
      if (local_18->m_end < (local_18->field_2).m_p) goto LAB_001808cd;
      if ((local_18->field_2).m_p != local_18->m_end) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x3b2,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
      }
      goto LAB_00180824;
    }
    load_s_smparams(this);
  }
  else {
    load_s_smparams_new(this,local_18);
    if (local_18->m_end < (local_18->field_2).m_p) goto LAB_001808cd;
    if ((local_18->field_2).m_p != local_18->m_end) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3ac,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
LAB_00180824:
    xr_reader::close_chunk(r,&local_18);
  }
  local_18 = xr_reader::open_chunk(r,0x1a);
  if (local_18 == (xr_reader *)0x0) {
    local_18 = xr_reader::open_chunk(r,0xe);
    if (local_18 == (xr_reader *)0x0) {
      __assert_fail("s != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3c0,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
    load_s_motions(this,local_18);
    if (local_18->m_end < (local_18->field_2).m_p) goto LAB_001808cd;
    if ((local_18->field_2).m_p != local_18->m_end) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3c2,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
  }
  else {
    load_s_motions_new(this,local_18);
    if (local_18->m_end < (local_18->field_2).m_p) {
LAB_001808cd:
      __assert_fail("m_p <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                    ,0x7e,"bool xray_re::xr_reader::eof() const");
    }
    if ((local_18->field_2).m_p != local_18->m_end) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x3bc,"void xray_re::xr_ogf_v3::load_kinematics_animated(xr_reader &)");
    }
  }
LAB_001808b0:
  xr_reader::close_chunk(r,&local_18);
  return;
}

Assistant:

void xr_ogf_v3::load_kinematics_animated(xr_reader& r) {
	load_kinematics(r);
	xr_reader* s = r.open_chunk(OGF3_S_MOTION_REFS);
	if (s) {
		load_s_motion_refs(*s);
		r.close_chunk(s);
	} else {
		s = r.open_chunk(OGF3_S_SMPARAMS_NEW);
		if (s) {
			load_s_smparams_new(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_SMPARAMS);
			if (s) {
				load_s_smparams(*s);
				xr_assert(s->eof());
				r.close_chunk(s);
			} else {
				load_s_smparams();
			}
		}

		s = r.open_chunk(OGF3_S_MOTIONS_NEW);
		if (s) {
			load_s_motions_new(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_MOTIONS);
			xr_assert(s != 0);
			load_s_motions(*s);
			assert(s->eof());
			r.close_chunk(s);
		}
	}
}